

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

bool kratos::check_stmt_condition
               (Stmt *stmt,function<bool_(kratos::Stmt_*)> *cond,bool check_unreachable,
               bool full_branch)

{
  undefined8 uVar1;
  bool bVar2;
  StatementType SVar3;
  uint uVar4;
  int iVar5;
  InternalException *pIVar6;
  pointer ppVar7;
  element_type *stmt_00;
  uint64_t uVar8;
  StmtException *this;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *pmVar9;
  element_type *peVar10;
  element_type *peVar11;
  size_type sVar12;
  Stmt *pSVar13;
  size_type local_3d8;
  bool local_3c2;
  bool local_3c1;
  IfStmt *local_3b0;
  bool local_399;
  pointer local_360;
  SwitchStmt *local_338;
  StmtBlock *local_2d0;
  undefined1 local_2c0 [8];
  shared_ptr<kratos::ScopedStmtBlock> body;
  string local_2a8;
  undefined1 local_288 [8];
  ForStmt *stmt__2;
  shared_ptr<kratos::ScopedStmtBlock> *else_;
  shared_ptr<kratos::ScopedStmtBlock> *then;
  string local_268;
  IfStmt *local_248;
  IfStmt *stmt__1;
  shared_ptr<kratos::Const> local_238;
  _Self local_228;
  undefined1 local_220 [24];
  Enum *enum_def;
  string local_200;
  undefined1 local_1e0 [24];
  EnumType *enum_var;
  int local_1b4;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  uint32_t targeted_cases;
  element_type *scope_stmt;
  pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_> *iter;
  iterator __end4;
  iterator __begin4;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range4;
  uint32_t found_case;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  cases;
  string local_148;
  SwitchStmt *local_128;
  SwitchStmt *stmt_;
  __normal_iterator<kratos::Stmt_**,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  local_118;
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
  local_110 [8];
  __normal_iterator<kratos::Stmt_**,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  local_108;
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
  local_100 [15];
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_d0 [32];
  uint64_t i;
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmts;
  element_type *s;
  uint64_t stmt_count;
  allocator<char> local_61;
  string local_60;
  StmtBlock *local_40;
  StmtBlock *block;
  pointer ppStack_30;
  bool found;
  uint64_t index;
  bool full_branch_local;
  _Base_ptr p_Stack_20;
  bool check_unreachable_local;
  function<bool_(kratos::Stmt_*)> *cond_local;
  Stmt *stmt_local;
  
  index._6_1_ = full_branch;
  index._7_1_ = check_unreachable;
  p_Stack_20 = (_Base_ptr)cond;
  cond_local = (function<bool_(kratos::Stmt_*)> *)stmt;
  bVar2 = std::function<bool_(kratos::Stmt_*)>::operator()(cond,stmt);
  if (bVar2) {
    stmt_local._7_1_ = 1;
  }
  else {
    SVar3 = Stmt::type((Stmt *)cond_local);
    if (SVar3 == Block) {
      block._7_1_ = 0;
      if (cond_local == (function<bool_(kratos::Stmt_*)> *)0x0) {
        local_2d0 = (StmtBlock *)0x0;
      }
      else {
        local_2d0 = (StmtBlock *)__dynamic_cast(cond_local,&Stmt::typeinfo,&StmtBlock::typeinfo,0);
      }
      local_40 = local_2d0;
      if (local_2d0 == (StmtBlock *)0x0) {
        pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,
                   "Statement is not block but is marked as StatementType::Block",&local_61);
        InternalException::InternalException(pIVar6,&local_60);
        __cxa_throw(pIVar6,&InternalException::typeinfo,InternalException::~InternalException);
      }
      ppVar7 = (pointer)StmtBlock::size(local_2d0);
      for (ppStack_30 = (pointer)0x0; ppStack_30 < ppVar7;
          ppStack_30 = (pointer)&(ppStack_30->first).field_0x1) {
        StmtBlock::get_stmt((StmtBlock *)
                            &stmts.
                             super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(uint64_t)local_40);
        stmt_00 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                             &stmts.
                              super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::shared_ptr<kratos::Stmt>::~shared_ptr
                  ((shared_ptr<kratos::Stmt> *)
                   &stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar2 = check_stmt_condition
                          (stmt_00,(function<bool_(kratos::Stmt_*)> *)p_Stack_20,
                           (bool)(index._7_1_ & 1),(bool)(index._6_1_ & 1));
        if (bVar2) {
          block._7_1_ = 1;
          break;
        }
      }
      ppVar7 = ppStack_30;
      if ((((block._7_1_ & 1) != 0) && ((index._7_1_ & 1) != 0)) &&
         (uVar8 = StmtBlock::size(local_40), ppVar7 != (pointer)(uVar8 - 1))) {
        std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::vector
                  ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&i);
        local_d0._24_8_ = ppStack_30;
        while( true ) {
          local_d0._24_8_ = &(((pointer)local_d0._24_8_)->first).field_0x1;
          uVar1 = local_d0._24_8_;
          ppVar7 = (pointer)StmtBlock::size(local_40);
          if (ppVar7 <= (ulong)uVar1) break;
          StmtBlock::get_stmt((StmtBlock *)local_d0,(uint64_t)local_40);
          local_d0._16_8_ =
               std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
          std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::Stmt*>
                    ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)&i,
                     (Stmt **)(local_d0 + 0x10));
          std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_d0);
        }
        stmt_._7_1_ = 1;
        this = (StmtException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"Unreachable code block",&local_f1);
        local_108._M_current =
             (Stmt **)std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::begin
                                ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&i);
        __gnu_cxx::
        __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
        ::__normal_iterator<kratos::Stmt**>(local_100,&local_108);
        local_118._M_current =
             (Stmt **)std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::end
                                ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&i);
        __gnu_cxx::
        __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
        ::__normal_iterator<kratos::Stmt**>(local_110,&local_118);
        StmtException::StmtException
                  (this,&local_f0,(const_iterator *)local_100,(const_iterator *)local_110);
        stmt_._7_1_ = 0;
        __cxa_throw(this,&StmtException::typeinfo,StmtException::~StmtException);
      }
      stmt_local._7_1_ = block._7_1_ & 1;
    }
    else {
      SVar3 = Stmt::type((Stmt *)cond_local);
      if (SVar3 == Switch) {
        if (cond_local == (function<bool_(kratos::Stmt_*)> *)0x0) {
          local_338 = (SwitchStmt *)0x0;
        }
        else {
          local_338 = (SwitchStmt *)
                      __dynamic_cast(cond_local,&Stmt::typeinfo,&SwitchStmt::typeinfo,0);
        }
        local_128 = local_338;
        if (local_338 == (SwitchStmt *)0x0) {
          cases._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
          pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_148,
                     "Statement is not switch but is marked as StatementType::Switch",
                     (allocator<char> *)
                     ((long)&cases._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
          InternalException::InternalException(pIVar6,&local_148);
          cases._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
          __cxa_throw(pIVar6,&InternalException::typeinfo,InternalException::~InternalException);
        }
        pmVar9 = SwitchStmt::body(local_338);
        std::
        map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
        ::map((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
               *)&found_case,pmVar9);
        bVar2 = std::
                map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                ::empty((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                         *)&found_case);
        if (bVar2) {
          stmt_local._7_1_ = 0;
        }
        else {
          __range4._0_4_ = 0;
          __end4 = std::
                   map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                   ::begin((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                            *)&found_case);
          iter = (pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>
                  *)std::
                    map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                    ::end((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                           *)&found_case);
          while (bVar2 = std::operator!=(&__end4,(_Self *)&iter), bVar2) {
            scope_stmt = (element_type *)
                         std::
                         _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
                         ::operator*(&__end4);
            _Stack_1b0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(((reference)scope_stmt)->second).
                             super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                           );
            bVar2 = check_stmt_condition
                              ((Stmt *)_Stack_1b0._M_pi,
                               (function<bool_(kratos::Stmt_*)> *)p_Stack_20,(bool)(index._7_1_ & 1)
                               ,(bool)(index._6_1_ & 1));
            if (bVar2) {
              __range4._0_4_ = (int)__range4 + 1;
            }
            else if ((index._6_1_ & 1) != 0) {
              stmt_local._7_1_ = 0;
              goto LAB_00386b92;
            }
            std::
            _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
            ::operator++(&__end4);
          }
          SwitchStmt::target((SwitchStmt *)&enum_var);
          peVar10 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&enum_var);
          uVar4 = (*(peVar10->super_IRNode)._vptr_IRNode[0x1a])();
          std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&enum_var);
          if ((uVar4 & 1) == 0) {
            SwitchStmt::target((SwitchStmt *)local_220);
            peVar10 = std::
                      __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_220);
            iVar5 = (*(peVar10->super_IRNode)._vptr_IRNode[7])();
            local_1b4 = 1 << ((byte)iVar5 & 0x1f);
            std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_220);
          }
          else {
            SwitchStmt::target((SwitchStmt *)local_1e0);
            peVar11 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_1e0)
            ;
            if (peVar11 == (element_type *)0x0) {
              local_360 = (pointer)0x0;
            }
            else {
              local_360 = (pointer)__dynamic_cast(peVar11,&Var::typeinfo,&EnumType::typeinfo,
                                                  0xfffffffffffffffe);
            }
            std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_1e0);
            local_1e0._16_8_ = local_360;
            if (local_360 == (pointer)0x0) {
              enum_def._6_1_ = 1;
              pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_200,"Unable to resolve enum type",
                         (allocator<char> *)((long)&enum_def + 7));
              InternalException::InternalException(pIVar6,&local_200);
              enum_def._6_1_ = 0;
              __cxa_throw(pIVar6,&InternalException::typeinfo,InternalException::~InternalException)
              ;
            }
            local_220._16_8_ = (*(code *)**(undefined8 **)&local_360->first)();
            sVar12 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>_>_>_>
                     ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>_>_>_>
                             *)&(((pointer)local_220._16_8_)->first).field_2);
            local_1b4 = (int)sVar12;
          }
          if ((index._6_1_ & 1) == 0) {
            stmt_local._7_1_ = (int)__range4 != 0;
          }
          else {
            std::shared_ptr<kratos::Const>::shared_ptr(&local_238,(nullptr_t)0x0);
            local_228._M_node =
                 (_Base_ptr)
                 std::
                 map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 ::find((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                         *)&found_case,&local_238);
            stmt__1 = (IfStmt *)
                      std::
                      map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                      ::end((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                             *)&found_case);
            local_399 = std::operator!=(&local_228,(_Self *)&stmt__1);
            local_399 = local_399 || (int)__range4 == local_1b4;
            stmt_local._7_1_ = local_399;
            std::shared_ptr<kratos::Const>::~shared_ptr(&local_238);
          }
        }
LAB_00386b92:
        std::
        map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
        ::~map((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                *)&found_case);
      }
      else {
        SVar3 = Stmt::type((Stmt *)cond_local);
        if (SVar3 == If) {
          if (cond_local == (function<bool_(kratos::Stmt_*)> *)0x0) {
            local_3b0 = (IfStmt *)0x0;
          }
          else {
            local_3b0 = (IfStmt *)__dynamic_cast(cond_local,&Stmt::typeinfo,&IfStmt::typeinfo,0);
          }
          local_248 = local_3b0;
          if (local_3b0 == (IfStmt *)0x0) {
            then._6_1_ = 1;
            pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_268,"Statement is not if but is marked as StatementType::If"
                       ,(allocator<char> *)((long)&then + 7));
            InternalException::InternalException(pIVar6,&local_268);
            then._6_1_ = 0;
            __cxa_throw(pIVar6,&InternalException::typeinfo,InternalException::~InternalException);
          }
          else_ = IfStmt::then_body(local_3b0);
          stmt__2 = (ForStmt *)IfStmt::else_body(local_248);
          if ((index._6_1_ & 1) == 0) {
            pSVar13 = (Stmt *)std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                              ::get(&else_->
                                     super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                   );
            bVar2 = check_stmt_condition
                              (pSVar13,(function<bool_(kratos::Stmt_*)> *)p_Stack_20,
                               (bool)(index._7_1_ & 1),(bool)(index._6_1_ & 1));
            local_3c2 = true;
            if (!bVar2) {
              pSVar13 = (Stmt *)std::
                                __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::
                                get((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                     *)stmt__2);
              local_3c2 = check_stmt_condition
                                    (pSVar13,(function<bool_(kratos::Stmt_*)> *)p_Stack_20,
                                     (bool)(index._7_1_ & 1),(bool)(index._6_1_ & 1));
            }
            stmt_local._7_1_ = local_3c2;
          }
          else {
            pSVar13 = (Stmt *)std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                              ::get(&else_->
                                     super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                   );
            bVar2 = check_stmt_condition
                              (pSVar13,(function<bool_(kratos::Stmt_*)> *)p_Stack_20,
                               (bool)(index._7_1_ & 1),(bool)(index._6_1_ & 1));
            local_3c1 = false;
            if (bVar2) {
              pSVar13 = (Stmt *)std::
                                __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::
                                get((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                     *)stmt__2);
              local_3c1 = check_stmt_condition
                                    (pSVar13,(function<bool_(kratos::Stmt_*)> *)p_Stack_20,
                                     (bool)(index._7_1_ & 1),(bool)(index._6_1_ & 1));
            }
            stmt_local._7_1_ = local_3c1;
          }
        }
        else {
          SVar3 = Stmt::type((Stmt *)cond_local);
          if (SVar3 == For) {
            if (cond_local == (function<bool_(kratos::Stmt_*)> *)0x0) {
              local_3d8 = 0;
            }
            else {
              local_3d8 = __dynamic_cast(cond_local,&Stmt::typeinfo,&ForStmt::typeinfo,0);
            }
            local_288 = (undefined1  [8])local_3d8;
            if (local_3d8 == 0) {
              body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._6_1_ = 1;
              pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2a8,
                         "Statement is not if but is marked as StatementType::For",
                         (allocator<char> *)
                         ((long)&body.
                                 super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7));
              InternalException::InternalException(pIVar6,&local_2a8);
              body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._6_1_ = 0;
              __cxa_throw(pIVar6,&InternalException::typeinfo,InternalException::~InternalException)
              ;
            }
            ForStmt::get_loop_body((ForStmt *)local_2c0);
            pSVar13 = (Stmt *)std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                              ::get((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_2c0);
            stmt_local._7_1_ =
                 check_stmt_condition
                           (pSVar13,(function<bool_(kratos::Stmt_*)> *)p_Stack_20,
                            (bool)(index._7_1_ & 1),(bool)(index._6_1_ & 1));
            std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
                      ((shared_ptr<kratos::ScopedStmtBlock> *)local_2c0);
          }
          else {
            stmt_local._7_1_ = 0;
          }
        }
      }
    }
  }
  return (bool)(stmt_local._7_1_ & 1);
}

Assistant:

bool check_stmt_condition(Stmt* stmt, const std::function<bool(Stmt*)>& cond,
                          bool check_unreachable = false, bool full_branch = true) {
    if (cond(stmt)) {
        return true;
    } else if (stmt->type() == StatementType::Block) {
        // it has to be the last block
        uint64_t index;
        bool found = false;
        auto* block = dynamic_cast<StmtBlock*>(stmt);
        if (!block)
            throw InternalException("Statement is not block but is marked as StatementType::Block");
        auto stmt_count = block->size();
        for (index = 0; index < stmt_count; index++) {
            auto* s = block->get_stmt(index).get();
            if (check_stmt_condition(s, cond, check_unreachable, full_branch)) {
                found = true;
                break;
            }
        }
        if (found && check_unreachable) {
            if (index != block->size() - 1) {
                // we have unreachable state
                std::vector<Stmt*> stmts;
                for (uint64_t i = index + 1; i < block->size(); i++)
                    stmts.emplace_back(block->get_stmt(i).get());
                throw StmtException("Unreachable code block", stmts.begin(), stmts.end());
            }
        }
        return found;
    } else if (stmt->type() == StatementType::Switch) {
        auto* stmt_ = dynamic_cast<SwitchStmt*>(stmt);
        if (!stmt_)
            throw InternalException(
                "Statement is not switch but is marked as StatementType::Switch");
        auto cases = stmt_->body();
        if (cases.empty()) return false;
        uint32_t found_case = 0;
        for (auto const& iter : cases) {
            auto* scope_stmt = iter.second.get();
            if (check_stmt_condition(scope_stmt, cond, check_unreachable, full_branch))
                found_case++;
            else if (full_branch)
                return false;
        }
        // make sure default case is covered
        // if there is no default case, all the cases have to be covered
        // the only exception is that if the target is an enum and we've covered all it's enum case
        uint32_t targeted_cases;
        if (stmt_->target()->is_enum()) {
            auto* enum_var = dynamic_cast<EnumType*>(stmt_->target().get());
            if (!enum_var) throw InternalException("Unable to resolve enum type");
            auto const* enum_def = enum_var->enum_type();
            targeted_cases = enum_def->values.size();
        } else {
            targeted_cases = 1u << stmt_->target()->width();
        }
        if (full_branch) {
            return cases.find(nullptr) != cases.end() || found_case == targeted_cases;
        } else {
            return found_case > 0;
        }
    } else if (stmt->type() == StatementType::If) {
        auto* stmt_ = dynamic_cast<IfStmt*>(stmt);
        if (!stmt_)
            throw InternalException("Statement is not if but is marked as StatementType::If");
        auto const& then = stmt_->then_body();
        auto const& else_ = stmt_->else_body();
        if (full_branch) {
            return check_stmt_condition(then.get(), cond, check_unreachable, full_branch) &&
                   check_stmt_condition(else_.get(), cond, check_unreachable, full_branch);
        } else {
            return check_stmt_condition(then.get(), cond, check_unreachable, full_branch) ||
                   check_stmt_condition(else_.get(), cond, check_unreachable, full_branch);
        }
    } else if (stmt->type() == StatementType::For) {
        auto* stmt_ = dynamic_cast<ForStmt*>(stmt);
        if (!stmt_)
            throw InternalException("Statement is not if but is marked as StatementType::For");
        auto body = stmt_->get_loop_body();
        return check_stmt_condition(body.get(), cond, check_unreachable, full_branch);
    }
    return false;
}